

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

int __thiscall cmCTestLaunch::Run(cmCTestLaunch *this)

{
  bool bVar1;
  cmCTestLaunch *this_local;
  
  if (this->Process == (cmsysProcess_s *)0x0) {
    std::operator<<((ostream *)&std::cerr,"Could not allocate cmsysProcess instance!\n");
    this_local._4_4_ = -1;
  }
  else {
    RunChild(this);
    bVar1 = CheckResults(this);
    if (bVar1) {
      this_local._4_4_ = this->ExitCode;
    }
    else {
      LoadConfig(this);
      WriteXML(this);
      this_local._4_4_ = this->ExitCode;
    }
  }
  return this_local._4_4_;
}

Assistant:

int cmCTestLaunch::Run()
{
  if (!this->Process) {
    std::cerr << "Could not allocate cmsysProcess instance!\n";
    return -1;
  }

  this->RunChild();

  if (this->CheckResults()) {
    return this->ExitCode;
  }

  this->LoadConfig();
  this->WriteXML();

  return this->ExitCode;
}